

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  uchar uVar2;
  short sVar3;
  stbi__uint32 sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  int iVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  uint uVar30;
  short sVar31;
  bool bVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined4 z;
  undefined4 z_00;
  undefined4 z_01;
  stbi_uc sVar39;
  byte bVar40;
  stbi_uc sVar41;
  stbi_uc sVar42;
  stbi_uc sVar43;
  byte bVar44;
  stbi__uint32 sVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  uint uVar51;
  uint uVar52;
  stbi__jpeg *psVar53;
  char *pcVar54;
  ulong uVar55;
  float *data_00;
  uchar *data_01;
  void *pvVar56;
  code *pcVar57;
  stbi__context *psVar58;
  uchar *puVar59;
  long lVar60;
  long lVar61;
  undefined7 uVar62;
  short sVar63;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int why;
  uint uVar64;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *paVar65;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *extraout_RDX_02;
  ulong extraout_RDX_03;
  stbi_uc *extraout_RDX_04;
  stbi_uc *psVar66;
  stbi_uc *extraout_RDX_05;
  stbi_uc *extraout_RDX_06;
  short *psVar67;
  stbi_uc *psVar68;
  uint uVar69;
  ulong uVar70;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar71;
  stbi__uint32 sVar72;
  int iVar73;
  ulong uVar74;
  ulong uVar75;
  uint uVar76;
  stbi_uc (*pasVar77) [4];
  stbi__context *psVar78;
  int *piVar79;
  long in_FS_OFFSET;
  bool bVar80;
  undefined1 auVar81 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  stbi_uc *coutput [4];
  short data [64];
  int local_8998;
  ulong local_8970;
  uint local_8948;
  uint local_891c;
  undefined1 local_8918 [12];
  uint uStack_890c;
  undefined1 local_8908 [16];
  int local_88f8;
  undefined4 local_88f0;
  int local_88ec;
  int local_88e8;
  uint local_88e4;
  ulong local_88e0;
  int local_88d8;
  int local_88d4;
  int local_88d0;
  int local_88cc;
  int local_88c8;
  int local_88c4;
  ulong local_88c0;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar66 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar53 = (stbi__jpeg *)malloc(0x4888);
  psVar53->s = s;
  psVar53->idct_block_kernel = stbi__idct_simd;
  psVar53->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar53->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar53->jfif = 0;
  psVar53->app14_color_transform = -1;
  psVar53->marker = 0xff;
  sVar39 = stbi__get_marker(psVar53);
  if (sVar39 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar53);
  if (sVar39 == 0xd8) {
    psVar53 = (stbi__jpeg *)malloc(0x4888);
    psVar53->s = s;
    psVar53->idct_block_kernel = stbi__idct_simd;
    psVar53->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar53->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar53->img_comp[0].raw_data = (void *)0x0;
      psVar53->img_comp[0].raw_coeff = (void *)0x0;
      psVar53->img_comp[1].raw_data = (void *)0x0;
      psVar53->img_comp[1].raw_coeff = (void *)0x0;
      psVar53->img_comp[2].raw_data = (void *)0x0;
      psVar53->img_comp[2].raw_coeff = (void *)0x0;
      psVar53->img_comp[3].raw_data = (void *)0x0;
      psVar53->img_comp[3].raw_coeff = (void *)0x0;
      psVar53->restart_interval = 0;
      iVar46 = stbi__decode_jpeg_header(psVar53,0);
      uVar76 = extraout_EDX;
      if (iVar46 != 0) {
        paVar1 = psVar53->img_comp;
        bVar40 = stbi__get_marker(psVar53);
LAB_00132ed8:
        if (bVar40 == 0xda) {
          psVar58 = psVar53->s;
          sVar39 = stbi__get8(psVar58);
          sVar41 = stbi__get8(psVar58);
          bVar40 = stbi__get8(psVar53->s);
          psVar53->scan_n = (uint)bVar40;
          if ((0xfb < (byte)(bVar40 - 5)) &&
             (psVar58 = psVar53->s, (int)(uint)bVar40 <= psVar58->img_n)) {
            paVar65 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)CONCAT11(sVar39,sVar41);
            if ((uint)CONCAT11(sVar39,sVar41) != (uint)bVar40 * 2 + 6) {
              pcVar54 = "bad SOS len";
              goto LAB_00134325;
            }
            lVar61 = 0;
            do {
              bVar40 = stbi__get8(psVar58);
              bVar44 = stbi__get8(psVar53->s);
              psVar58 = psVar53->s;
              uVar76 = psVar58->img_n;
              if ((long)(int)uVar76 < 1) {
                uVar70 = 0;
              }
              else {
                uVar70 = 0;
                paVar65 = paVar1;
                while (paVar65->id != (uint)bVar40) {
                  uVar70 = uVar70 + 1;
                  paVar65 = paVar65 + 1;
                  if ((long)(int)uVar76 == uVar70) goto LAB_0013432e;
                }
              }
              if ((uint)uVar70 == uVar76) goto LAB_0013432e;
              uVar74 = uVar70 & 0xffffffff;
              paVar65 = (anon_struct_96_18_0d0905d3 *)(uVar74 * 0x60);
              psVar53->img_comp[uVar74].hd = (uint)(bVar44 >> 4);
              if (0x3f < bVar44) {
                pcVar54 = "bad DC huff";
                goto LAB_00134325;
              }
              paVar65 = paVar1 + uVar74;
              paVar65->ha = bVar44 & 0xf;
              if (3 < (bVar44 & 0xf)) {
                pcVar54 = "bad AC huff";
                goto LAB_00134325;
              }
              psVar53->order[lVar61] = (uint)uVar70;
              lVar61 = lVar61 + 1;
            } while (lVar61 < psVar53->scan_n);
            bVar40 = stbi__get8(psVar58);
            psVar53->spec_start = (uint)bVar40;
            bVar40 = stbi__get8(psVar53->s);
            psVar53->spec_end = (uint)bVar40;
            bVar40 = stbi__get8(psVar53->s);
            psVar53->succ_high = (uint)(bVar40 >> 4);
            uVar76 = bVar40 & 0xf;
            paVar65 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar76;
            psVar53->succ_low = uVar76;
            iVar46 = psVar53->progressive;
            iVar73 = psVar53->spec_start;
            if (iVar46 == 0) {
              if ((iVar73 != 0) || ((0xf < bVar40 || ((bVar40 & 0xf) != 0)))) {
LAB_00134dbb:
                pcVar54 = "bad SOS";
                goto LAB_00134325;
              }
              psVar53->spec_end = 0x3f;
            }
            else if ((((0x3f < iVar73) || (0x3f < psVar53->spec_end)) ||
                     (psVar53->spec_end < iVar73)) || ((0xdf < bVar40 || (0xd < uVar76))))
            goto LAB_00134dbb;
            uVar76 = psVar53->scan_n;
            uVar70 = (ulong)uVar76;
            iVar73 = psVar53->restart_interval;
            if (iVar73 == 0) {
              iVar73 = 0x7fffffff;
            }
            psVar53->code_buffer = 0;
            psVar53->code_bits = 0;
            psVar53->nomore = 0;
            psVar53->img_comp[3].dc_pred = 0;
            psVar53->img_comp[2].dc_pred = 0;
            psVar53->img_comp[1].dc_pred = 0;
            psVar53->img_comp[0].dc_pred = 0;
            psVar53->marker = 0xff;
            psVar53->todo = iVar73;
            psVar53->eob_run = 0;
            if (iVar46 == 0) {
              if (uVar76 == 1) {
                iVar46 = psVar53->order[0];
                iVar73 = psVar53->img_comp[iVar46].y + 7 >> 3;
                bVar80 = true;
                uVar76 = 1;
                if (0 < iVar73) {
                  uVar51 = paVar1[iVar46].x + 7 >> 3;
                  iVar47 = 0;
                  iVar71 = 0;
                  do {
                    if (0 < (int)uVar51) {
                      lVar61 = 0;
                      do {
                        iVar48 = stbi__jpeg_decode_block
                                           (psVar53,(short *)&local_88a8,
                                            (stbi__huffman *)
                                            psVar53->huff_dc[paVar1[iVar46].hd].fast,
                                            (stbi__huffman *)
                                            psVar53->huff_ac[paVar1[iVar46].ha].fast,
                                            psVar53->fast_ac[paVar1[iVar46].ha],iVar46,
                                            psVar53->dequant[paVar1[iVar46].tq]);
                        uVar76 = extraout_EDX_02;
                        if (iVar48 == 0) goto LAB_00133c01;
                        (*psVar53->idct_block_kernel)
                                  (paVar1[iVar46].data + lVar61 + iVar47 * paVar1[iVar46].w2,
                                   paVar1[iVar46].w2,(short *)&local_88a8);
                        uVar76 = (uint)extraout_RDX_03;
                        iVar48 = psVar53->todo;
                        psVar53->todo = iVar48 + -1;
                        uVar70 = extraout_RDX_03;
                        if (iVar48 < 2) {
                          if (psVar53->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar53);
                            uVar76 = extraout_EDX_03;
                          }
                          if ((psVar53->marker & 0xf8) != 0xd0) goto LAB_00133bfa;
                          psVar53->code_buffer = 0;
                          psVar53->code_bits = 0;
                          psVar53->nomore = 0;
                          psVar53->img_comp[3].dc_pred = 0;
                          psVar53->img_comp[2].dc_pred = 0;
                          psVar53->img_comp[1].dc_pred = 0;
                          psVar53->img_comp[0].dc_pred = 0;
                          psVar53->marker = 0xff;
                          iVar48 = psVar53->restart_interval;
                          uVar70 = 0x7fffffff;
                          if (iVar48 == 0) {
                            iVar48 = 0x7fffffff;
                          }
                          psVar53->todo = iVar48;
                          psVar53->eob_run = 0;
                        }
                        lVar61 = lVar61 + 8;
                      } while ((ulong)uVar51 * 8 != lVar61);
                    }
                    uVar76 = (uint)uVar70;
                    iVar71 = iVar71 + 1;
                    iVar47 = iVar47 + 8;
                  } while (iVar71 != iVar73);
LAB_00133bfa:
                  bVar80 = true;
                }
              }
              else {
                uVar76 = psVar53->img_mcu_y;
                uVar70 = (ulong)uVar76;
                bVar80 = true;
                if (0 < (int)uVar76) {
                  iVar46 = psVar53->img_mcu_x;
                  iVar71 = 0;
                  do {
                    if (0 < iVar46) {
                      uVar51 = 0;
                      do {
                        iVar46 = psVar53->scan_n;
                        if (0 < iVar46) {
                          uVar70 = 0;
                          do {
                            iVar73 = psVar53->order[uVar70];
                            iVar47 = psVar53->img_comp[iVar73].v;
                            if (0 < iVar47) {
                              iVar46 = paVar1[iVar73].h;
                              iVar48 = 0;
                              do {
                                if (0 < iVar46) {
                                  iVar47 = 0;
                                  do {
                                    iVar49 = paVar1[iVar73].v;
                                    iVar50 = stbi__jpeg_decode_block
                                                       (psVar53,(short *)&local_88a8,
                                                        (stbi__huffman *)
                                                        psVar53->huff_dc[paVar1[iVar73].hd].fast,
                                                        (stbi__huffman *)
                                                        psVar53->huff_ac[paVar1[iVar73].ha].fast,
                                                        psVar53->fast_ac[paVar1[iVar73].ha],iVar73,
                                                        psVar53->dequant[paVar1[iVar73].tq]);
                                    uVar76 = extraout_EDX_05;
                                    if (iVar50 == 0) goto LAB_00133c01;
                                    (*psVar53->idct_block_kernel)
                                              (paVar1[iVar73].data +
                                               (long)(int)((iVar46 * uVar51 + iVar47) * 8) +
                                               (long)((iVar49 * iVar71 + iVar48) * paVar1[iVar73].w2
                                                     * 8),paVar1[iVar73].w2,(short *)&local_88a8);
                                    iVar47 = iVar47 + 1;
                                    iVar46 = paVar1[iVar73].h;
                                  } while (iVar47 < iVar46);
                                  iVar47 = paVar1[iVar73].v;
                                }
                                iVar48 = iVar48 + 1;
                              } while (iVar48 < iVar47);
                              iVar46 = psVar53->scan_n;
                            }
                            uVar70 = uVar70 + 1;
                          } while ((long)uVar70 < (long)iVar46);
                          iVar73 = psVar53->todo;
                        }
                        uVar76 = (uint)uVar70;
                        psVar53->todo = iVar73 + -1;
                        bVar80 = iVar73 < 2;
                        iVar73 = iVar73 + -1;
                        if (bVar80) {
                          if (psVar53->code_bits < 0x18) {
                            stbi__grow_buffer_unsafe(psVar53);
                            uVar76 = extraout_EDX_06;
                          }
                          if ((psVar53->marker & 0xf8) != 0xd0) goto LAB_00133bfa;
                          psVar53->code_buffer = 0;
                          psVar53->code_bits = 0;
                          psVar53->nomore = 0;
                          psVar53->img_comp[3].dc_pred = 0;
                          psVar53->img_comp[2].dc_pred = 0;
                          psVar53->img_comp[1].dc_pred = 0;
                          psVar53->img_comp[0].dc_pred = 0;
                          psVar53->marker = 0xff;
                          iVar73 = psVar53->restart_interval;
                          if (iVar73 == 0) {
                            iVar73 = 0x7fffffff;
                          }
                          psVar53->todo = iVar73;
                          psVar53->eob_run = 0;
                        }
                        uVar51 = uVar51 + 1;
                        uVar70 = (ulong)uVar51;
                        iVar46 = psVar53->img_mcu_x;
                      } while ((int)uVar51 < iVar46);
                      uVar70 = (ulong)(uint)psVar53->img_mcu_y;
                    }
                    iVar71 = iVar71 + 1;
                    uVar76 = (uint)uVar70;
                  } while (iVar71 < (int)uVar76);
                  goto LAB_00133bfa;
                }
              }
              goto LAB_00133c03;
            }
            if (uVar76 == 1) {
              uVar70 = (ulong)psVar53->order[0];
              local_88e8 = psVar53->img_comp[uVar70].y + 7 >> 3;
              local_88e0 = uVar70;
              if (0 < local_88e8) {
                iVar73 = psVar53->img_comp[uVar70].x + 7 >> 3;
                iVar46 = 0;
                do {
                  if (0 < iVar73) {
                    iVar71 = 0;
                    do {
                      psVar67 = paVar1[uVar70].coeff +
                                (paVar1[uVar70].coeff_w * iVar46 + iVar71) * 0x40;
                      uVar74 = (ulong)psVar53->spec_start;
                      if (uVar74 == 0) {
                        iVar47 = stbi__jpeg_decode_block_prog_dc
                                           (psVar53,psVar67,
                                            (stbi__huffman *)
                                            psVar53->huff_dc[paVar1[uVar70].hd].fast,(int)local_88e0
                                           );
                        uVar76 = extraout_EDX_01;
                        if (iVar47 == 0) goto LAB_0013432e;
                      }
                      else {
                        iVar47 = paVar1[uVar70].ha;
                        psVar66 = psVar53->huff_ac[iVar47].fast;
                        iVar48 = psVar53->eob_run;
                        bVar40 = (byte)psVar53->succ_low;
                        if (psVar53->succ_high == 0) {
                          if (iVar48 == 0) {
                            do {
                              if (psVar53->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar53);
                              }
                              sVar63 = psVar53->fast_ac[iVar47][psVar53->code_buffer >> 0x17];
                              uVar76 = (uint)sVar63;
                              iVar48 = (int)uVar74;
                              if (sVar63 == 0) {
                                uVar76 = stbi__jpeg_huff_decode(psVar53,(stbi__huffman *)psVar66);
                                paVar65 = extraout_RDX_02;
                                if ((int)uVar76 < 0) goto LAB_00134ce3;
                                uVar51 = uVar76 >> 4;
                                if ((uVar76 & 0xf) == 0) {
                                  if (uVar76 < 0xf0) {
                                    iVar48 = 1 << ((byte)uVar51 & 0x1f);
                                    psVar53->eob_run = iVar48;
                                    if (0xf < uVar76) {
                                      iVar48 = stbi__jpeg_get_bits(psVar53,uVar51);
                                      iVar48 = iVar48 + psVar53->eob_run;
                                    }
                                    goto LAB_0013331c;
                                  }
                                  uVar74 = (ulong)(iVar48 + 0x10);
                                }
                                else {
                                  uVar74 = (ulong)((int)((long)iVar48 + (ulong)uVar51) + 1);
                                  bVar44 = ""[(long)iVar48 + (ulong)uVar51];
                                  iVar48 = stbi__extend_receive(psVar53,uVar76 & 0xf);
                                  psVar67[bVar44] = (short)(iVar48 << (bVar40 & 0x1f));
                                }
                              }
                              else {
                                lVar61 = (long)iVar48 + (ulong)(uVar76 >> 4 & 0xf);
                                psVar53->code_buffer = psVar53->code_buffer << (sbyte)(uVar76 & 0xf)
                                ;
                                psVar53->code_bits = psVar53->code_bits - (uVar76 & 0xf);
                                uVar74 = (ulong)((int)lVar61 + 1);
                                psVar67[""[lVar61]] = (short)((uVar76 >> 8) << (bVar40 & 0x1f));
                              }
                            } while ((int)uVar74 <= psVar53->spec_end);
                          }
                          else {
LAB_0013331c:
                            psVar53->eob_run = iVar48 + -1;
                          }
                        }
                        else if (iVar48 == 0) {
                          iVar47 = 0x10000 << (bVar40 & 0x1f);
                          do {
                            uVar76 = stbi__jpeg_huff_decode(psVar53,(stbi__huffman *)psVar66);
                            paVar65 = extraout_RDX_01;
                            if ((int)uVar76 < 0) goto LAB_00134ce3;
                            uVar51 = uVar76 >> 4;
                            if ((uVar76 & 0xf) == 1) {
                              iVar49 = stbi__jpeg_get_bit(psVar53);
                              iVar48 = 1;
                              if (iVar49 == 0) {
                                iVar48 = 0xffff;
                              }
                              sVar63 = (short)(iVar48 << (bVar40 & 0x1f));
                            }
                            else {
                              if ((uVar76 & 0xf) != 0) goto LAB_00134ce3;
                              if (uVar76 < 0xf0) {
                                psVar53->eob_run = ~(-1 << ((byte)uVar51 & 0x1f));
                                uVar69 = 0x40;
                                if (0xf < uVar76) {
                                  iVar48 = stbi__jpeg_get_bits(psVar53,uVar51);
                                  psVar53->eob_run = psVar53->eob_run + iVar48;
                                }
                              }
                              else {
                                uVar69 = 0xf;
                              }
                              uVar51 = uVar69;
                              sVar63 = 0;
                            }
                            uVar76 = psVar53->spec_end;
                            uVar55 = (ulong)uVar76;
                            if ((int)uVar74 <= (int)uVar76) {
                              uVar75 = (long)(int)uVar74;
                              do {
                                uVar76 = (uint)uVar55;
                                bVar44 = ""[uVar75];
                                if (psVar67[bVar44] == 0) {
                                  if (uVar51 == 0) {
                                    uVar74 = (ulong)((int)uVar75 + 1);
                                    psVar67[bVar44] = sVar63;
                                    break;
                                  }
                                  uVar51 = uVar51 - 1;
                                }
                                else {
                                  iVar48 = stbi__jpeg_get_bit(psVar53);
                                  if ((iVar48 != 0) &&
                                     (sVar3 = psVar67[bVar44], (iVar47 >> 0x10 & (int)sVar3) == 0))
                                  {
                                    sVar31 = (short)((uint)iVar47 >> 0x10);
                                    if (sVar3 < 1) {
                                      sVar31 = -sVar31;
                                    }
                                    psVar67[bVar44] = sVar3 + sVar31;
                                  }
                                }
                                uVar74 = uVar75 + 1;
                                uVar76 = psVar53->spec_end;
                                uVar55 = (ulong)(int)uVar76;
                                bVar80 = (long)uVar75 < (long)uVar55;
                                uVar75 = uVar74;
                              } while (bVar80);
                            }
                          } while ((int)uVar74 <= (int)uVar76);
                        }
                        else {
                          psVar53->eob_run = iVar48 + -1;
                          if (psVar53->spec_start <= psVar53->spec_end) {
                            uVar76 = (0x10000 << (bVar40 & 0x1f)) >> 0x10;
                            do {
                              bVar40 = ""[uVar74];
                              if (((psVar67[bVar40] != 0) &&
                                  (iVar47 = stbi__jpeg_get_bit(psVar53), iVar47 != 0)) &&
                                 (sVar63 = psVar67[bVar40], (uVar76 & (int)sVar63) == 0)) {
                                uVar51 = -uVar76;
                                if (0 < sVar63) {
                                  uVar51 = uVar76;
                                }
                                psVar67[bVar40] = (short)uVar51 + sVar63;
                              }
                              bVar80 = (long)uVar74 < (long)psVar53->spec_end;
                              uVar74 = uVar74 + 1;
                            } while (bVar80);
                          }
                        }
                      }
                      iVar47 = psVar53->todo;
                      psVar53->todo = iVar47 + -1;
                      if (iVar47 < 2) {
                        if (psVar53->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar53);
                        }
                        bVar40 = psVar53->marker;
                        if ((bVar40 & 0xf8) != 0xd0) goto LAB_00133c16;
                        psVar53->code_buffer = 0;
                        psVar53->code_bits = 0;
                        psVar53->nomore = 0;
                        psVar53->img_comp[3].dc_pred = 0;
                        psVar53->img_comp[2].dc_pred = 0;
                        psVar53->img_comp[1].dc_pred = 0;
                        psVar53->img_comp[0].dc_pred = 0;
                        psVar53->marker = 0xff;
                        iVar47 = psVar53->restart_interval;
                        if (iVar47 == 0) {
                          iVar47 = 0x7fffffff;
                        }
                        psVar53->todo = iVar47;
                        psVar53->eob_run = 0;
                      }
                      iVar71 = iVar71 + 1;
                    } while (iVar71 != iVar73);
                  }
                  iVar46 = iVar46 + 1;
                } while (iVar46 != local_88e8);
              }
            }
            else {
              iVar46 = psVar53->img_mcu_y;
              if (0 < iVar46) {
                iVar71 = psVar53->img_mcu_x;
                iVar47 = 0;
                do {
                  if (0 < iVar71) {
                    iVar46 = 0;
                    do {
                      iVar71 = psVar53->scan_n;
                      if (0 < iVar71) {
                        lVar61 = 0;
                        do {
                          iVar73 = psVar53->order[lVar61];
                          iVar48 = psVar53->img_comp[iVar73].v;
                          if (0 < iVar48) {
                            iVar71 = paVar1[iVar73].h;
                            iVar49 = 0;
                            do {
                              if (0 < iVar71) {
                                iVar48 = 0;
                                do {
                                  iVar71 = stbi__jpeg_decode_block_prog_dc
                                                     (psVar53,paVar1[iVar73].coeff +
                                                              (iVar71 * iVar46 + iVar48 +
                                                              (paVar1[iVar73].v * iVar47 + iVar49) *
                                                              paVar1[iVar73].coeff_w) * 0x40,
                                                      (stbi__huffman *)
                                                      psVar53->huff_dc[paVar1[iVar73].hd].fast,
                                                      iVar73);
                                  uVar76 = extraout_EDX_04;
                                  if (iVar71 == 0) goto LAB_0013432e;
                                  iVar48 = iVar48 + 1;
                                  iVar71 = paVar1[iVar73].h;
                                } while (iVar48 < iVar71);
                                iVar48 = paVar1[iVar73].v;
                              }
                              iVar49 = iVar49 + 1;
                            } while (iVar49 < iVar48);
                            iVar71 = psVar53->scan_n;
                          }
                          lVar61 = lVar61 + 1;
                        } while (lVar61 < iVar71);
                        iVar73 = psVar53->todo;
                      }
                      psVar53->todo = iVar73 + -1;
                      bVar80 = iVar73 < 2;
                      iVar73 = iVar73 + -1;
                      if (bVar80) {
                        if (psVar53->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar53);
                        }
                        bVar40 = psVar53->marker;
                        if ((bVar40 & 0xf8) != 0xd0) goto LAB_00133c16;
                        psVar53->code_buffer = 0;
                        psVar53->code_bits = 0;
                        psVar53->nomore = 0;
                        psVar53->img_comp[3].dc_pred = 0;
                        psVar53->img_comp[2].dc_pred = 0;
                        psVar53->img_comp[1].dc_pred = 0;
                        psVar53->img_comp[0].dc_pred = 0;
                        psVar53->marker = 0xff;
                        iVar73 = psVar53->restart_interval;
                        if (iVar73 == 0) {
                          iVar73 = 0x7fffffff;
                        }
                        psVar53->todo = iVar73;
                        psVar53->eob_run = 0;
                      }
                      iVar46 = iVar46 + 1;
                      iVar71 = psVar53->img_mcu_x;
                    } while (iVar46 < iVar71);
                    iVar46 = psVar53->img_mcu_y;
                  }
                  iVar47 = iVar47 + 1;
                } while (iVar47 < iVar46);
              }
            }
            goto LAB_00133c0b;
          }
          pcVar54 = "bad SOS component count";
          paVar65 = extraout_RDX_00;
          goto LAB_00134325;
        }
        uVar76 = (uint)bVar40;
        if (uVar76 == 0xdc) {
          psVar58 = psVar53->s;
          sVar39 = stbi__get8(psVar58);
          sVar41 = stbi__get8(psVar58);
          psVar58 = psVar53->s;
          sVar42 = stbi__get8(psVar58);
          sVar43 = stbi__get8(psVar58);
          paVar65 = extraout_RDX;
          if (CONCAT11(sVar39,sVar41) == 4) {
            if ((uint)CONCAT11(sVar42,sVar43) == psVar53->s->img_y) goto LAB_00132f64;
            pcVar54 = "bad DNL height";
          }
          else {
            pcVar54 = "bad DNL len";
          }
          goto LAB_00134325;
        }
        if (uVar76 == 0xd9) {
          psVar78 = psVar53->s;
          uVar76 = psVar78->img_n;
          if (psVar53->progressive == 0) goto LAB_00134155;
          if (0 < (int)uVar76) {
            lVar61 = 0;
            do {
              iVar46 = psVar53->img_comp[lVar61].y + 7 >> 3;
              if (0 < iVar46) {
                uVar76 = paVar1[lVar61].x + 7 >> 3;
                iVar73 = 0;
                do {
                  if (0 < (int)uVar76) {
                    uVar70 = 0;
                    do {
                      psVar67 = paVar1[lVar61].coeff +
                                (paVar1[lVar61].coeff_w * iVar73 + (int)uVar70) * 0x40;
                      iVar71 = paVar1[lVar61].tq;
                      lVar60 = 0;
                      do {
                        psVar67[lVar60] = psVar67[lVar60] * psVar53->dequant[iVar71][lVar60];
                        lVar60 = lVar60 + 1;
                      } while (lVar60 != 0x40);
                      (*psVar53->idct_block_kernel)
                                (paVar1[lVar61].data +
                                 uVar70 * 8 + (long)(iVar73 * 8 * paVar1[lVar61].w2),
                                 paVar1[lVar61].w2,psVar67);
                      uVar70 = uVar70 + 1;
                    } while (uVar70 != uVar76);
                  }
                  iVar73 = iVar73 + 1;
                } while (iVar73 != iVar46);
                psVar78 = psVar53->s;
              }
              lVar61 = lVar61 + 1;
              uVar76 = psVar78->img_n;
            } while (lVar61 < (int)uVar76);
LAB_00134155:
            uVar51 = (2 < (int)uVar76) + 1 + (uint)(2 < (int)uVar76);
            if (req_comp != 0) {
              uVar51 = req_comp;
            }
            if (uVar76 == 3) {
              bVar80 = true;
              uVar69 = 3;
              if (psVar53->rgb != 3) {
                uVar76 = 3;
                if (psVar53->app14_color_transform != 0) goto LAB_0013443a;
                bVar80 = psVar53->jfif == 0;
              }
            }
            else {
LAB_0013443a:
              uVar69 = uVar76;
              bVar80 = false;
            }
            uVar76 = 1;
            if (bVar80) {
              uVar76 = uVar69;
            }
            if (uVar69 != 3) {
              uVar76 = uVar69;
            }
            if (2 < (int)uVar51) {
              uVar76 = uVar69;
            }
            local_8908 = (undefined1  [16])0x0;
            _local_8918 = (undefined1  [16])0x0;
            sVar45 = psVar78->img_x;
            if (0 < (int)uVar76) {
              lVar61 = 0;
              do {
                pvVar56 = malloc((ulong)(sVar45 + 3));
                *(void **)((long)&psVar53->img_comp[0].linebuf + lVar61 * 2) = pvVar56;
                if (pvVar56 == (void *)0x0) {
                  stbi__free_jpeg_components(psVar53,uVar69,why);
                  *(char **)(in_FS_OFFSET + -0x10) = "outofmem";
                  psVar58 = (stbi__context *)0x0;
                  goto LAB_00134347;
                }
                uVar70 = (long)psVar53->img_h_max /
                         (long)*(int *)((long)&psVar53->img_comp[0].h + lVar61 * 2);
                iVar46 = (int)uVar70;
                *(int *)((long)(local_88a8.pal + -7) + lVar61) = iVar46;
                iVar73 = psVar53->img_v_max / *(int *)((long)&psVar53->img_comp[0].v + lVar61 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar61) = iVar73;
                *(int *)((long)(local_88a8.pal + -4) + lVar61) = iVar73 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar61) =
                     (int)((ulong)((sVar45 - 1) + iVar46) / (uVar70 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar61) = 0;
                uVar8 = *(undefined8 *)((long)&psVar53->img_comp[0].data + lVar61 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar61) = uVar8;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar61) = uVar8;
                if (iVar46 == 2) {
                  pcVar57 = stbi__resample_row_h_2;
                  if (iVar73 != 1) {
                    if (iVar73 != 2) goto LAB_00134587;
                    pcVar57 = psVar53->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar46 == 1) {
                  pcVar57 = stbi__resample_row_generic;
                  if (iVar73 == 2) {
                    pcVar57 = stbi__resample_row_v_2;
                  }
                  if (iVar73 == 1) {
                    pcVar57 = resample_row_1;
                  }
                }
                else {
LAB_00134587:
                  pcVar57 = stbi__resample_row_generic;
                }
                *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar61) = pcVar57;
                lVar61 = lVar61 + 0x30;
              } while ((ulong)uVar76 * 0x30 != lVar61);
            }
            sVar4 = psVar78->img_y;
            psVar58 = (stbi__context *)stbi__malloc_mad3(uVar51,sVar45,sVar4,1);
            iVar46 = (int)extraout_RDX_04;
            if (psVar58 != (stbi__context *)0x0) {
              if (sVar4 != 0) {
                iVar73 = 0;
                uVar69 = 0;
                psVar66 = extraout_RDX_04;
                do {
                  sVar45 = psVar78->img_x;
                  if (0 < (int)uVar76) {
                    pasVar77 = (stbi_uc (*) [4])&local_88a8.ratio;
                    uVar70 = 0;
                    piVar79 = &psVar53->img_comp[0].y;
                    do {
                      asVar5 = pasVar77[-1];
                      asVar6 = pasVar77[-3];
                      iVar46 = (int)asVar6 >> 1;
                      auVar119 = (**(code **)(pasVar77 + -10))
                                           (*(stbi_uc **)(piVar79 + 10),
                                            *(undefined8 *)
                                             (*pasVar77 +
                                             ((ulong)(iVar46 <= (int)asVar5) << 3 |
                                             0xffffffffffffffe0)),
                                            *(undefined8 *)
                                             (*pasVar77 +
                                             ((ulong)((int)asVar5 < iVar46) << 3 |
                                             0xffffffffffffffe0)),pasVar77[-2],pasVar77[-4]);
                      psVar66 = auVar119._8_8_;
                      *(long *)(local_8918 + uVar70 * 8) = auVar119._0_8_;
                      pasVar77[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar6 <= (int)asVar5 + 1) {
                        pasVar77[-1] = (stbi_uc  [4])0x0;
                        *(stbi_uc **)(pasVar77 + -8) = *(stbi_uc **)(pasVar77 + -6);
                        asVar5 = *pasVar77;
                        *pasVar77 = (stbi_uc  [4])((int)asVar5 + 1);
                        if ((int)asVar5 + 1 < *piVar79) {
                          *(stbi_uc **)(pasVar77 + -6) = *(stbi_uc **)(pasVar77 + -6) + piVar79[1];
                        }
                      }
                      uVar70 = uVar70 + 1;
                      piVar79 = piVar79 + 0x18;
                      pasVar77 = pasVar77 + 0xc;
                    } while (uVar76 != uVar70);
                  }
                  if ((int)uVar51 < 3) {
                    psVar78 = psVar53->s;
                    if (bVar80) {
                      if (uVar51 == 1) {
                        if (psVar78->img_x != 0) {
                          uVar70 = 0;
                          do {
                            bVar40 = *(byte *)(local_8908._0_8_ + uVar70);
                            psVar58->buffer_start[uVar70 + sVar45 * iVar73 + -0x38] =
                                 (stbi_uc)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3
                                           + (uint)stack0xffffffffffff76f0[uVar70] * 0x96 +
                                             (uint)*(byte *)(local_8918._0_8_ + uVar70) * 0x4d >> 8)
                            ;
                            uVar70 = uVar70 + 1;
                            psVar66 = (stbi_uc *)local_8908._0_8_;
                          } while (uVar70 < psVar78->img_x);
                        }
                      }
                      else if (psVar78->img_x != 0) {
                        uVar70 = 0;
                        do {
                          bVar40 = *(byte *)(local_8908._0_8_ + uVar70);
                          psVar58->buffer_start[uVar70 * 2 + (ulong)(sVar45 * iVar73) + -0x38] =
                               (stbi_uc)((uint)bVar40 * 2 + ((uint)bVar40 + (uint)bVar40 * 8) * 3 +
                                         (uint)stack0xffffffffffff76f0[uVar70] * 0x96 +
                                         (uint)*(byte *)(local_8918._0_8_ + uVar70) * 0x4d >> 8);
                          psVar58->buffer_start[uVar70 * 2 + (ulong)(sVar45 * iVar73) + -0x37] =
                               0xff;
                          uVar70 = uVar70 + 1;
                          psVar66 = (stbi_uc *)local_8908._0_8_;
                        } while (uVar70 < psVar78->img_x);
                      }
                    }
                    else if (psVar78->img_n == 4) {
                      if (psVar53->app14_color_transform == 2) {
                        if (psVar78->img_x != 0) {
                          psVar68 = psVar58->buffer_start + ((ulong)(sVar45 * iVar73) - 0x37);
                          psVar66 = (stbi_uc *)0x0;
                          do {
                            iVar46 = (*(byte *)(local_8918._0_8_ + (long)psVar66) ^ 0xff) *
                                     (uint)psVar66[local_8908._8_8_];
                            psVar68[-1] = (char)((iVar46 + 0x80U >> 8) + iVar46 + 0x80 >> 8);
                            *psVar68 = 0xff;
                            psVar66 = psVar66 + 1;
                            psVar68 = psVar68 + uVar51;
                          } while (psVar66 < (stbi_uc *)(ulong)psVar78->img_x);
                        }
                      }
                      else {
                        if (psVar53->app14_color_transform != 0) goto LAB_001349ef;
                        if (psVar78->img_x != 0) {
                          psVar68 = psVar58->buffer_start + ((ulong)(sVar45 * iVar73) - 0x37);
                          uVar70 = 0;
                          do {
                            bVar40 = *(byte *)(local_8908._8_8_ + uVar70);
                            iVar46 = (uint)*(byte *)(local_8918._0_8_ + uVar70) * (uint)bVar40;
                            iVar71 = (uint)stack0xffffffffffff76f0[uVar70] * (uint)bVar40;
                            psVar68[-1] = (char)((((uint)*(byte *)(local_8908._0_8_ + uVar70) *
                                                   (uint)bVar40 + 0x80 >> 8) +
                                                  (uint)*(byte *)(local_8908._0_8_ + uVar70) *
                                                  (uint)bVar40 + 0x80 >> 8) * 0x1d +
                                                 (iVar71 + (iVar71 + 0x80U >> 8) + 0x80 >> 8) * 0x96
                                                 + (iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8) *
                                                   0x4d >> 8);
                            *psVar68 = 0xff;
                            uVar70 = uVar70 + 1;
                            psVar68 = psVar68 + uVar51;
                            psVar66 = stack0xffffffffffff76f0;
                          } while (uVar70 < psVar78->img_x);
                        }
                      }
                    }
                    else {
LAB_001349ef:
                      if (uVar51 == 1) {
                        if (psVar78->img_x != 0) {
                          psVar68 = (stbi_uc *)0x0;
                          do {
                            (psVar58->buffer_start + ((ulong)(sVar45 * iVar73) - 0x38))
                            [(long)psVar68] = *(stbi_uc *)(local_8918._0_8_ + (long)psVar68);
                            psVar68 = psVar68 + 1;
                            psVar66 = (stbi_uc *)(ulong)psVar78->img_x;
                          } while (psVar68 < (stbi_uc *)(ulong)psVar78->img_x);
                        }
                      }
                      else if (psVar78->img_x != 0) {
                        psVar68 = (stbi_uc *)0x0;
                        do {
                          psVar58->buffer_start
                          [(long)psVar68 * 2 + (ulong)(sVar45 * iVar73) + -0x38] =
                               *(stbi_uc *)(local_8918._0_8_ + (long)psVar68);
                          psVar58->buffer_start
                          [(long)psVar68 * 2 + (ulong)(sVar45 * iVar73) + -0x37] = 0xff;
                          psVar68 = psVar68 + 1;
                          psVar66 = (stbi_uc *)(ulong)psVar78->img_x;
                        } while (psVar68 < (stbi_uc *)(ulong)psVar78->img_x);
                      }
                    }
                  }
                  else {
                    psVar78 = psVar53->s;
                    if (psVar78->img_n == 3) {
                      if (bVar80) {
                        if (psVar78->img_x != 0) {
                          psVar68 = psVar58->buffer_start + ((ulong)(sVar45 * iVar73) - 0x35);
                          psVar66 = (stbi_uc *)0x0;
                          do {
                            psVar68[-3] = *(stbi_uc *)(local_8918._0_8_ + (long)psVar66);
                            psVar68[-2] = stack0xffffffffffff76f0[(long)psVar66];
                            psVar68[-1] = *(stbi_uc *)(local_8908._0_8_ + (long)psVar66);
                            *psVar68 = 0xff;
                            psVar66 = psVar66 + 1;
                            psVar68 = psVar68 + uVar51;
                          } while (psVar66 < (stbi_uc *)(ulong)psVar78->img_x);
                        }
                      }
                      else {
LAB_00134a62:
                        (*psVar53->YCbCr_to_RGB_kernel)
                                  (psVar58->buffer_start +
                                   ((ulong)(uVar69 * uVar51 * sVar45) - 0x38),
                                   (stbi_uc *)local_8918._0_8_,stack0xffffffffffff76f0,
                                   (stbi_uc *)local_8908._0_8_,psVar78->img_x,uVar51);
                        psVar78 = psVar53->s;
                        psVar66 = extraout_RDX_05;
                      }
                    }
                    else if (psVar78->img_n == 4) {
                      if (psVar53->app14_color_transform == 2) {
                        (*psVar53->YCbCr_to_RGB_kernel)
                                  (psVar58->buffer_start +
                                   ((ulong)(uVar69 * uVar51 * sVar45) - 0x38),
                                   (stbi_uc *)local_8918._0_8_,stack0xffffffffffff76f0,
                                   (stbi_uc *)local_8908._0_8_,psVar78->img_x,uVar51);
                        psVar78 = psVar53->s;
                        psVar66 = extraout_RDX_06;
                        if (psVar78->img_x != 0) {
                          psVar68 = psVar58->buffer_start + ((ulong)(sVar45 * iVar73) - 0x36);
                          uVar70 = 0;
                          do {
                            bVar40 = *(byte *)(local_8908._8_8_ + uVar70);
                            iVar46 = (psVar68[-2] ^ 0xff) * (uint)bVar40;
                            psVar68[-2] = (byte)((iVar46 + 0x80U >> 8) + iVar46 + 0x80 >> 8);
                            iVar46 = (psVar68[-1] ^ 0xff) * (uint)bVar40;
                            psVar68[-1] = (byte)(iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8);
                            iVar46 = (*psVar68 ^ 0xff) * (uint)bVar40;
                            uVar64 = iVar46 + 0x80U >> 8;
                            *psVar68 = (byte)(iVar46 + uVar64 + 0x80 >> 8);
                            uVar70 = uVar70 + 1;
                            psVar68 = psVar68 + uVar51;
                            psVar66 = (stbi_uc *)(ulong)uVar64;
                          } while (uVar70 < psVar78->img_x);
                        }
                      }
                      else {
                        if (psVar53->app14_color_transform != 0) goto LAB_00134a62;
                        if (psVar78->img_x != 0) {
                          psVar68 = psVar58->buffer_start + ((ulong)(sVar45 * iVar73) - 0x35);
                          uVar70 = 0;
                          do {
                            bVar40 = *(byte *)(local_8908._8_8_ + uVar70);
                            iVar46 = (uint)*(byte *)(local_8918._0_8_ + uVar70) * (uint)bVar40;
                            psVar68[-3] = (char)((iVar46 + 0x80U >> 8) + iVar46 + 0x80 >> 8);
                            iVar46 = (uint)stack0xffffffffffff76f0[uVar70] * (uint)bVar40;
                            psVar68[-2] = (char)(iVar46 + (iVar46 + 0x80U >> 8) + 0x80 >> 8);
                            psVar68[-1] = (char)((uint)*(byte *)(local_8908._0_8_ + uVar70) *
                                                 (uint)bVar40 +
                                                 ((uint)*(byte *)(local_8908._0_8_ + uVar70) *
                                                  (uint)bVar40 + 0x80 >> 8) + 0x80 >> 8);
                            *psVar68 = 0xff;
                            uVar70 = uVar70 + 1;
                            psVar68 = psVar68 + uVar51;
                            psVar66 = (stbi_uc *)local_8908._0_8_;
                          } while (uVar70 < psVar78->img_x);
                        }
                      }
                    }
                    else if (psVar78->img_x != 0) {
                      psVar68 = psVar58->buffer_start + ((ulong)(sVar45 * iVar73) - 0x35);
                      uVar70 = 0;
                      do {
                        sVar39 = *(stbi_uc *)(local_8918._0_8_ + uVar70);
                        psVar68[-1] = sVar39;
                        psVar68[-2] = sVar39;
                        psVar68[-3] = sVar39;
                        *psVar68 = 0xff;
                        uVar70 = uVar70 + 1;
                        psVar68 = psVar68 + uVar51;
                      } while (uVar70 < psVar78->img_x);
                    }
                  }
                  iVar46 = (int)psVar66;
                  uVar69 = uVar69 + 1;
                  iVar73 = iVar73 + uVar51;
                } while (uVar69 < psVar78->img_y);
                uVar69 = psVar78->img_n;
              }
              stbi__free_jpeg_components(psVar53,uVar69,iVar46);
              psVar78 = psVar53->s;
              *x = psVar78->img_x;
              *y = psVar78->img_y;
              if (comp != (int *)0x0) {
                *comp = (uint)(2 < psVar78->img_n) * 2 + 1;
              }
              goto LAB_00134347;
            }
            stbi__free_jpeg_components(psVar53,uVar69,iVar46);
            pcVar54 = "outofmem";
            goto LAB_00132cd0;
          }
          uVar51 = req_comp + (uint)(req_comp == 0);
          goto LAB_0013443a;
        }
        iVar46 = stbi__process_marker(psVar53,uVar76);
        uVar76 = extraout_EDX_00;
        if (iVar46 != 0) goto LAB_00132f64;
      }
LAB_0013432e:
      stbi__free_jpeg_components(psVar53,psVar53->s->img_n,uVar76);
    }
    else {
      pcVar54 = "bad req_comp";
LAB_00132cd0:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar54;
    }
    psVar58 = (stbi__context *)0x0;
  }
  else {
    lVar61 = 0;
    do {
      sVar39 = stbi__get8(s);
      if (sVar39 != (&stbi__check_png_header_png_sig)[lVar61]) {
        *(char **)(in_FS_OFFSET + -0x10) = "bad png sig";
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
        sVar39 = stbi__get8(s);
        if ((sVar39 != 'B') || (sVar39 = stbi__get8(s), sVar39 != 'M')) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
LAB_00133c92:
          iVar46 = stbi__gif_test(s);
          if (iVar46 != 0) {
            memset(&local_88a8,0,0x8870);
            psVar58 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar66);
            if (psVar58 == (stbi__context *)0x0 || psVar58 == s) {
              if ((stbi__jpeg *)local_88a8.out != (stbi__jpeg *)0x0) {
                free(local_88a8.out);
              }
              psVar58 = (stbi__context *)0x0;
            }
            else {
              *x = local_88a8.w;
              *y = local_88a8.h;
              if ((req_comp & 0xfffffffbU) != 0) {
                psVar58 = (stbi__context *)
                          stbi__convert_format
                                    ((uchar *)psVar58,4,req_comp,local_88a8.w,local_88a8.h);
              }
            }
            free(local_88a8.history);
            psVar53 = (stbi__jpeg *)local_88a8.background;
            goto LAB_00134347;
          }
          sVar45 = stbi__get32be(s);
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if (sVar45 == 0x38425053) {
            pvVar56 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
            return pvVar56;
          }
          iVar46 = stbi__pic_test(s);
          if (iVar46 != 0) {
            pvVar56 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
            return pvVar56;
          }
          iVar46 = stbi__pnm_test(s);
          if (iVar46 != 0) {
            pvVar56 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
            return pvVar56;
          }
          iVar46 = stbi__hdr_test(s);
          if (iVar46 != 0) {
            data_00 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
            if (req_comp == 0) {
              req_comp = *comp;
            }
            psVar66 = stbi__hdr_to_ldr(data_00,*x,*y,req_comp);
            return psVar66;
          }
          iVar46 = stbi__tga_test(s);
          if (iVar46 != 0) {
            pvVar56 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
            return pvVar56;
          }
          pcVar54 = "unknown image type";
          goto LAB_00132d2f;
        }
        stbi__get32le(s);
        stbi__get8(s);
        stbi__get8(s);
        stbi__get8(s);
        stbi__get8(s);
        stbi__get32le(s);
        sVar45 = stbi__get32le(s);
        if (((sVar45 < 0x39) && ((0x100010000001000U >> ((ulong)sVar45 & 0x3f) & 1) != 0)) ||
           (sVar45 == 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
        }
        else {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if (sVar45 != 0x7c) goto LAB_00133c92;
        }
        local_8908._12_4_ = 0xff;
        pvVar56 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8918);
        if (pvVar56 == (void *)0x0) {
          return (void *)0x0;
        }
        uVar76 = s->img_y;
        uVar51 = -uVar76;
        if (0 < (int)uVar76) {
          uVar51 = uVar76;
        }
        s->img_y = uVar51;
        if ((uVar51 < 0x1000001) && (uVar69 = s->img_x, uVar69 < 0x1000001)) {
          z = local_8908._0_4_;
          z_00 = local_8908._4_4_;
          z_01 = local_8908._8_4_;
          uVar64 = local_8908._12_4_;
          if (local_8918._8_4_ == 0xc) {
            if (0x17 < (int)local_8918._0_4_) goto LAB_001341e1;
            uVar52 = ((local_8918._4_4_ - local_88f8) + -0x18) / 3;
LAB_001341c2:
            local_8970 = (ulong)uVar52;
            if (uVar52 == 0) goto LAB_001341e1;
            bVar80 = false;
LAB_00134268:
            bVar32 = local_8908._8_4_ == 0xff000000;
            local_8998 = local_8918._0_4_;
            iVar46 = 4 - (uint)(local_8908._8_4_ == 0);
          }
          else {
            if ((int)local_8918._0_4_ < 0x10) {
              uVar52 = local_8918._4_4_ - (local_88f8 + local_8918._8_4_) >> 2;
              goto LAB_001341c2;
            }
LAB_001341e1:
            if (s->img_buffer + ((long)s->callback_already_read - (long)s) + -0x38 !=
                (stbi_uc *)(long)(int)local_8918._4_4_) {
              pcVar54 = "bad offset";
              goto LAB_00132d2f;
            }
            local_8970 = 0;
            bVar80 = true;
            if (local_8918._0_4_ != 0x18 || local_8908._8_4_ != 0xff000000) goto LAB_00134268;
            bVar32 = true;
            iVar46 = 3;
            local_8998 = 0x18;
            bVar80 = true;
          }
          s->img_n = iVar46;
          if (2 < req_comp) {
            iVar46 = req_comp;
          }
          iVar73 = stbi__mad3sizes_valid(iVar46,uVar69,uVar51,0);
          if (iVar73 != 0) {
            uVar70 = 0;
            data_01 = (uchar *)stbi__malloc_mad3(iVar46,uVar69,uVar51,0);
            if (data_01 == (uchar *)0x0) {
              pcVar54 = "outofmem";
              goto LAB_00132d2f;
            }
            local_88e4 = uVar76;
            if (local_8998 < 0x10) {
              iVar73 = (int)local_8970;
              if (bVar80 || 0x100 < iVar73) {
                free(data_01);
                pcVar54 = "invalid";
                goto LAB_00132d2f;
              }
              if (0 < iVar73) {
                uVar70 = 0;
                do {
                  sVar39 = stbi__get8(s);
                  local_88a8.pal[uVar70 - 0xd][2] = sVar39;
                  sVar39 = stbi__get8(s);
                  local_88a8.pal[uVar70 - 0xd][1] = sVar39;
                  sVar39 = stbi__get8(s);
                  local_88a8.pal[uVar70 - 0xd][0] = sVar39;
                  if (local_8918._8_4_ != 0xc) {
                    stbi__get8(s);
                  }
                  local_88a8.pal[uVar70 - 0xd][3] = 0xff;
                  uVar70 = uVar70 + 1;
                } while (local_8970 != uVar70);
              }
              stbi__skip(s,(iVar73 * (local_8918._8_4_ == 0xc | 0xfffffffc) + local_8918._4_4_) -
                           (local_8918._8_4_ + local_88f8));
              if (local_8998 == 1) {
                sVar45 = s->img_y;
                if (0 < (int)sVar45) {
                  sVar4 = s->img_x;
                  iVar71 = 0;
                  iVar73 = 0;
                  do {
                    bVar40 = stbi__get8(s);
                    sVar45 = s->img_x;
                    if (0 < (int)sVar45) {
                      uVar76 = (uint)bVar40;
                      sVar72 = 0;
                      uVar51 = 7;
                      do {
                        uVar70 = (ulong)((uVar76 >> (uVar51 & 0x1f) & 1) != 0);
                        data_01[iVar71] = local_88a8.pal[uVar70 - 0xd][0];
                        data_01[(long)iVar71 + 1] = local_88a8.pal[uVar70 - 0xd][1];
                        data_01[(long)iVar71 + 2] = local_88a8.pal[uVar70 - 0xd][2];
                        iVar47 = iVar71 + 3;
                        if (iVar46 == 4) {
                          data_01[(long)iVar71 + 3] = 0xff;
                          iVar47 = iVar71 + 4;
                        }
                        iVar71 = iVar47;
                        sVar72 = sVar72 + 1;
                        if (sVar72 == sVar45) break;
                        if ((int)uVar51 < 1) {
                          bVar40 = stbi__get8(s);
                          uVar76 = (uint)bVar40;
                          sVar45 = s->img_x;
                          uVar51 = 7;
                        }
                        else {
                          uVar51 = uVar51 - 1;
                        }
                      } while ((int)sVar72 < (int)sVar45);
                    }
                    stbi__skip(s,-(sVar4 + 7 >> 3) & 3);
                    iVar73 = iVar73 + 1;
                    sVar45 = s->img_y;
                  } while (iVar73 < (int)sVar45);
                }
              }
              else {
                if (local_8998 == 8) {
                  uVar76 = s->img_x;
                }
                else {
                  if (local_8998 != 4) {
                    free(data_01);
                    pcVar54 = "bad bpp";
                    goto LAB_00132d2f;
                  }
                  uVar76 = s->img_x + 1 >> 1;
                }
                sVar45 = s->img_y;
                if (0 < (int)sVar45) {
                  local_8948 = -uVar76 & 3;
                  uVar70 = 0;
                  iVar73 = 0;
                  do {
                    if (0 < (int)s->img_x) {
                      iVar71 = 0;
                      do {
                        bVar40 = stbi__get8(s);
                        uVar51 = bVar40 & 0xf;
                        uVar76 = (uint)(bVar40 >> 4);
                        if (local_8998 != 4) {
                          uVar76 = (uint)bVar40;
                        }
                        uVar74 = (ulong)uVar76;
                        if (local_8998 != 4) {
                          uVar51 = 0;
                        }
                        lVar61 = (long)(int)uVar70;
                        uVar55 = lVar61 + 3;
                        data_01[lVar61] = local_88a8.pal[uVar74 - 0xd][0];
                        data_01[lVar61 + 1] = local_88a8.pal[uVar74 - 0xd][1];
                        data_01[lVar61 + 2] = local_88a8.pal[uVar74 - 0xd][2];
                        if (iVar46 == 4) {
                          data_01[lVar61 + 3] = 0xff;
                          uVar55 = (ulong)((int)uVar70 + 4);
                        }
                        if (iVar71 + 1U == s->img_x) {
                          uVar70 = uVar55 & 0xffffffff;
                          break;
                        }
                        if (local_8998 == 8) {
                          bVar40 = stbi__get8(s);
                          uVar51 = (uint)bVar40;
                        }
                        lVar61 = (long)(int)uVar55;
                        uVar70 = lVar61 + 3;
                        uVar74 = (ulong)uVar51;
                        data_01[lVar61] = local_88a8.pal[uVar74 - 0xd][0];
                        data_01[lVar61 + 1] = local_88a8.pal[uVar74 - 0xd][1];
                        data_01[lVar61 + 2] = local_88a8.pal[uVar74 - 0xd][2];
                        if (iVar46 == 4) {
                          data_01[lVar61 + 3] = 0xff;
                          uVar70 = (ulong)((int)uVar55 + 4);
                        }
                        iVar71 = iVar71 + 2;
                      } while (iVar71 < (int)s->img_x);
                    }
                    stbi__skip(s,local_8948);
                    iVar73 = iVar73 + 1;
                    sVar45 = s->img_y;
                  } while (iVar73 < (int)sVar45);
                }
              }
            }
            else {
              stbi__skip(s,local_8918._4_4_ - (local_8918._8_4_ + local_88f8));
              if (local_8998 == 0x10) {
                local_891c = s->img_x * 2 & 2;
LAB_00134e40:
                uVar62 = (undefined7)(uVar70 >> 8);
                if ((z != 0 && uStack_890c != 0) && z_00 != 0) {
                  iVar73 = stbi__high_bit(uStack_890c);
                  uVar76 = stbi__bitcount(uStack_890c);
                  iVar71 = stbi__high_bit(z);
                  uVar51 = stbi__bitcount(z);
                  iVar47 = stbi__high_bit(z_00);
                  uVar69 = stbi__bitcount(z_00);
                  local_88ec = stbi__high_bit(z_01);
                  uVar52 = stbi__bitcount(z_01);
                  if ((uVar52 < 9 && uVar69 < 9) && (uVar51 < 9 && uVar76 < 9)) {
                    iVar73 = iVar73 + -7;
                    iVar71 = iVar71 + -7;
                    iVar47 = iVar47 + -7;
                    iVar48 = local_88ec + -7;
                    local_88f0 = (undefined4)CONCAT71(uVar62,1);
                    bVar80 = false;
                    goto LAB_00134f51;
                  }
                }
                free(data_01);
                pcVar54 = "bad masks";
                goto LAB_00132d2f;
              }
              if (local_8998 == 0x20) {
                uVar76 = z ^ 0xff00 | z_00 ^ 0xff;
                uVar70 = (ulong)uVar76;
                local_891c = 0;
                if (!(bool)(bVar32 & (uStack_890c == 0xff0000 && uVar76 == 0))) goto LAB_00134e40;
                bVar80 = true;
              }
              else {
                local_891c = 0;
                if (local_8998 != 0x18) goto LAB_00134e40;
                local_891c = s->img_x & 3;
                bVar80 = false;
              }
              local_88f0 = 0;
              iVar73 = 0;
              iVar71 = 0;
              iVar47 = 0;
              iVar48 = 0;
              uVar76 = 0;
              uVar51 = 0;
              uVar69 = 0;
              uVar52 = 0;
LAB_00134f51:
              sVar45 = s->img_y;
              if (0 < (int)sVar45) {
                local_88e0 = (ulong)uVar76;
                local_88e8 = -iVar71;
                local_88c4 = 8 - uVar51;
                local_88b0 = (ulong)uVar51;
                local_88c8 = -iVar47;
                local_88cc = 8 - uVar69;
                local_88b8 = (ulong)uVar69;
                local_88d4 = -iVar48;
                local_88d0 = 8 - uVar52;
                local_88c0 = (ulong)uVar52;
                iVar50 = 0;
                iVar49 = 0;
                local_88ec = iVar48;
                do {
                  local_88d8 = iVar49;
                  if ((char)local_88f0 == '\0') {
                    if (0 < (int)s->img_x) {
                      iVar48 = 0;
                      do {
                        sVar39 = stbi__get8(s);
                        data_01[(long)iVar50 + 2] = sVar39;
                        sVar39 = stbi__get8(s);
                        data_01[(long)iVar50 + 1] = sVar39;
                        sVar39 = stbi__get8(s);
                        data_01[iVar50] = sVar39;
                        bVar40 = 0xff;
                        if (bVar80) {
                          bVar40 = stbi__get8(s);
                        }
                        iVar49 = iVar50 + 3;
                        if (iVar46 == 4) {
                          data_01[(long)iVar50 + 3] = bVar40;
                          iVar49 = iVar50 + 4;
                        }
                        iVar50 = iVar49;
                        uVar64 = uVar64 | bVar40;
                        iVar48 = iVar48 + 1;
                      } while (iVar48 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar48 = 0;
                    do {
                      if (local_8998 == 0x10) {
                        sVar39 = stbi__get8(s);
                        sVar41 = stbi__get8(s);
                        uVar51 = (uint)CONCAT11(sVar41,sVar39);
                      }
                      else {
                        uVar51 = stbi__get32le(s);
                      }
                      uVar69 = (uVar51 & uStack_890c) >> ((byte)iVar73 & 0x1f);
                      if (iVar73 < 0) {
                        uVar69 = (uVar51 & uStack_890c) << (-(byte)iVar73 & 0x1f);
                      }
                      uVar52 = (uVar51 & z) >> ((byte)iVar71 & 0x1f);
                      if (iVar71 < 0) {
                        uVar52 = (uVar51 & z) << ((byte)local_88e8 & 0x1f);
                      }
                      iVar49 = *(int *)(stbi__shiftsigned_mul_table + local_88b0 * 4);
                      bVar40 = stbi__shiftsigned_shift_table[local_88b0 * 4];
                      uVar30 = (uVar51 & z_00) >> ((byte)iVar47 & 0x1f);
                      if (iVar47 < 0) {
                        uVar30 = (uVar51 & z_00) << ((byte)local_88c8 & 0x1f);
                      }
                      iVar7 = *(int *)(stbi__shiftsigned_mul_table + local_88b8 * 4);
                      bVar44 = stbi__shiftsigned_shift_table[local_88b8 * 4];
                      data_01[iVar50] =
                           (uchar)((int)((uVar69 >> (8U - (char)uVar76 & 0x1f)) *
                                        *(int *)(stbi__shiftsigned_mul_table + local_88e0 * 4)) >>
                                  (stbi__shiftsigned_shift_table[local_88e0 * 4] & 0x1f));
                      data_01[(long)iVar50 + 1] =
                           (uchar)((int)((uVar52 >> ((byte)local_88c4 & 0x1f)) * iVar49) >>
                                  (bVar40 & 0x1f));
                      data_01[(long)iVar50 + 2] =
                           (uchar)((int)((uVar30 >> ((byte)local_88cc & 0x1f)) * iVar7) >>
                                  (bVar44 & 0x1f));
                      if (z_01 == 0) {
                        uVar51 = 0xff;
                      }
                      else {
                        uVar69 = (uVar51 & z_01) >> ((byte)local_88ec & 0x1f);
                        if (local_88ec < 0) {
                          uVar69 = (uVar51 & z_01) << ((byte)local_88d4 & 0x1f);
                        }
                        uVar51 = (int)((uVar69 >> ((byte)local_88d0 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned_mul_table + local_88c0 * 4)) >>
                                 (stbi__shiftsigned_shift_table[local_88c0 * 4] & 0x1f);
                      }
                      iVar49 = iVar50 + 3;
                      if (iVar46 == 4) {
                        data_01[(long)iVar50 + 3] = (uchar)uVar51;
                        iVar49 = iVar50 + 4;
                      }
                      iVar50 = iVar49;
                      uVar64 = uVar64 | uVar51;
                      iVar48 = iVar48 + 1;
                    } while (iVar48 < (int)s->img_x);
                  }
                  stbi__skip(s,local_891c);
                  iVar49 = local_88d8 + 1;
                  sVar45 = s->img_y;
                } while (iVar49 < (int)sVar45);
              }
            }
            auVar38 = _DAT_0015fce0;
            auVar37 = _DAT_0015fcd0;
            auVar36 = _DAT_0015fcc0;
            auVar35 = _DAT_0015fcb0;
            auVar34 = _DAT_0015b0d0;
            auVar33 = _DAT_0015b0b0;
            auVar119 = _DAT_0015b090;
            if (((iVar46 == 4) && (uVar64 == 0)) &&
               (uVar76 = s->img_x * sVar45 * 4 - 1, -1 < (int)uVar76)) {
              uVar51 = uVar76 >> 2;
              auVar81._4_4_ = 0;
              auVar81._0_4_ = uVar51;
              auVar81._8_4_ = uVar51;
              auVar81._12_4_ = 0;
              puVar59 = data_01 + uVar76;
              uVar70 = 0;
              do {
                auVar99._8_4_ = (int)uVar70;
                auVar99._0_8_ = uVar70;
                auVar99._12_4_ = (int)(uVar70 >> 0x20);
                auVar101 = auVar81 | auVar119;
                auVar103 = (auVar99 | auVar33) ^ auVar119;
                iVar73 = auVar101._0_4_;
                iVar49 = -(uint)(iVar73 < auVar103._0_4_);
                iVar71 = auVar101._4_4_;
                auVar105._4_4_ = -(uint)(iVar71 < auVar103._4_4_);
                iVar47 = auVar101._8_4_;
                iVar50 = -(uint)(iVar47 < auVar103._8_4_);
                iVar48 = auVar101._12_4_;
                auVar105._12_4_ = -(uint)(iVar48 < auVar103._12_4_);
                auVar82._4_4_ = iVar49;
                auVar82._0_4_ = iVar49;
                auVar82._8_4_ = iVar50;
                auVar82._12_4_ = iVar50;
                auVar82 = pshuflw(in_XMM1,auVar82,0xe8);
                auVar104._4_4_ = -(uint)(auVar103._4_4_ == iVar71);
                auVar104._12_4_ = -(uint)(auVar103._12_4_ == iVar48);
                auVar104._0_4_ = auVar104._4_4_;
                auVar104._8_4_ = auVar104._12_4_;
                auVar91 = pshuflw(in_XMM2,auVar104,0xe8);
                auVar105._0_4_ = auVar105._4_4_;
                auVar105._8_4_ = auVar105._12_4_;
                auVar103 = pshuflw(auVar82,auVar105,0xe8);
                auVar101._8_4_ = 0xffffffff;
                auVar101._0_8_ = 0xffffffffffffffff;
                auVar101._12_4_ = 0xffffffff;
                auVar101 = (auVar103 | auVar91 & auVar82) ^ auVar101;
                auVar101 = packssdw(auVar101,auVar101);
                if ((auVar101 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar59 = 0xff;
                }
                auVar91._4_4_ = iVar49;
                auVar91._0_4_ = iVar49;
                auVar91._8_4_ = iVar50;
                auVar91._12_4_ = iVar50;
                auVar105 = auVar104 & auVar91 | auVar105;
                auVar101 = packssdw(auVar105,auVar105);
                auVar103._8_4_ = 0xffffffff;
                auVar103._0_8_ = 0xffffffffffffffff;
                auVar103._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101 ^ auVar103,auVar101 ^ auVar103);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101._0_4_ >> 8 & 1) != 0) {
                  puVar59[-4] = 0xff;
                }
                auVar101 = (auVar99 | auVar34) ^ auVar119;
                auVar92._0_4_ = -(uint)(iVar73 < auVar101._0_4_);
                auVar92._4_4_ = -(uint)(iVar71 < auVar101._4_4_);
                auVar92._8_4_ = -(uint)(iVar47 < auVar101._8_4_);
                auVar92._12_4_ = -(uint)(iVar48 < auVar101._12_4_);
                auVar106._4_4_ = auVar92._0_4_;
                auVar106._0_4_ = auVar92._0_4_;
                auVar106._8_4_ = auVar92._8_4_;
                auVar106._12_4_ = auVar92._8_4_;
                iVar49 = -(uint)(auVar101._4_4_ == iVar71);
                iVar50 = -(uint)(auVar101._12_4_ == iVar48);
                auVar18._4_4_ = iVar49;
                auVar18._0_4_ = iVar49;
                auVar18._8_4_ = iVar50;
                auVar18._12_4_ = iVar50;
                auVar116._4_4_ = auVar92._4_4_;
                auVar116._0_4_ = auVar92._4_4_;
                auVar116._8_4_ = auVar92._12_4_;
                auVar116._12_4_ = auVar92._12_4_;
                auVar101 = auVar18 & auVar106 | auVar116;
                auVar101 = packssdw(auVar101,auVar101);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101 ^ auVar9,auVar101 ^ auVar9);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101._0_4_ >> 0x10 & 1) != 0) {
                  puVar59[-8] = 0xff;
                }
                auVar101 = pshufhw(auVar101,auVar106,0x84);
                auVar19._4_4_ = iVar49;
                auVar19._0_4_ = iVar49;
                auVar19._8_4_ = iVar50;
                auVar19._12_4_ = iVar50;
                auVar103 = pshufhw(auVar92,auVar19,0x84);
                auVar82 = pshufhw(auVar101,auVar116,0x84);
                auVar83._8_4_ = 0xffffffff;
                auVar83._0_8_ = 0xffffffffffffffff;
                auVar83._12_4_ = 0xffffffff;
                auVar83 = (auVar82 | auVar103 & auVar101) ^ auVar83;
                auVar101 = packssdw(auVar83,auVar83);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101._0_4_ >> 0x18 & 1) != 0) {
                  puVar59[-0xc] = 0xff;
                }
                auVar101 = (auVar99 | auVar38) ^ auVar119;
                auVar93._0_4_ = -(uint)(iVar73 < auVar101._0_4_);
                auVar93._4_4_ = -(uint)(iVar71 < auVar101._4_4_);
                auVar93._8_4_ = -(uint)(iVar47 < auVar101._8_4_);
                auVar93._12_4_ = -(uint)(iVar48 < auVar101._12_4_);
                auVar20._4_4_ = auVar93._0_4_;
                auVar20._0_4_ = auVar93._0_4_;
                auVar20._8_4_ = auVar93._8_4_;
                auVar20._12_4_ = auVar93._8_4_;
                auVar103 = pshuflw(auVar116,auVar20,0xe8);
                auVar84._0_4_ = -(uint)(auVar101._0_4_ == iVar73);
                auVar84._4_4_ = -(uint)(auVar101._4_4_ == iVar71);
                auVar84._8_4_ = -(uint)(auVar101._8_4_ == iVar47);
                auVar84._12_4_ = -(uint)(auVar101._12_4_ == iVar48);
                auVar107._4_4_ = auVar84._4_4_;
                auVar107._0_4_ = auVar84._4_4_;
                auVar107._8_4_ = auVar84._12_4_;
                auVar107._12_4_ = auVar84._12_4_;
                auVar101 = pshuflw(auVar84,auVar107,0xe8);
                auVar108._4_4_ = auVar93._4_4_;
                auVar108._0_4_ = auVar93._4_4_;
                auVar108._8_4_ = auVar93._12_4_;
                auVar108._12_4_ = auVar93._12_4_;
                auVar82 = pshuflw(auVar93,auVar108,0xe8);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101 & auVar103,(auVar82 | auVar101 & auVar103) ^ auVar10);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar59[-0x10] = 0xff;
                }
                auVar21._4_4_ = auVar93._0_4_;
                auVar21._0_4_ = auVar93._0_4_;
                auVar21._8_4_ = auVar93._8_4_;
                auVar21._12_4_ = auVar93._8_4_;
                auVar108 = auVar107 & auVar21 | auVar108;
                auVar82 = packssdw(auVar108,auVar108);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101,auVar82 ^ auVar11);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101._4_2_ >> 8 & 1) != 0) {
                  puVar59[-0x14] = 0xff;
                }
                auVar101 = (auVar99 | auVar37) ^ auVar119;
                auVar94._0_4_ = -(uint)(iVar73 < auVar101._0_4_);
                auVar94._4_4_ = -(uint)(iVar71 < auVar101._4_4_);
                auVar94._8_4_ = -(uint)(iVar47 < auVar101._8_4_);
                auVar94._12_4_ = -(uint)(iVar48 < auVar101._12_4_);
                auVar109._4_4_ = auVar94._0_4_;
                auVar109._0_4_ = auVar94._0_4_;
                auVar109._8_4_ = auVar94._8_4_;
                auVar109._12_4_ = auVar94._8_4_;
                iVar49 = -(uint)(auVar101._4_4_ == iVar71);
                iVar50 = -(uint)(auVar101._12_4_ == iVar48);
                auVar22._4_4_ = iVar49;
                auVar22._0_4_ = iVar49;
                auVar22._8_4_ = iVar50;
                auVar22._12_4_ = iVar50;
                auVar117._4_4_ = auVar94._4_4_;
                auVar117._0_4_ = auVar94._4_4_;
                auVar117._8_4_ = auVar94._12_4_;
                auVar117._12_4_ = auVar94._12_4_;
                auVar101 = auVar22 & auVar109 | auVar117;
                auVar101 = packssdw(auVar101,auVar101);
                auVar12._8_4_ = 0xffffffff;
                auVar12._0_8_ = 0xffffffffffffffff;
                auVar12._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101 ^ auVar12,auVar101 ^ auVar12);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar59[-0x18] = 0xff;
                }
                auVar101 = pshufhw(auVar101,auVar109,0x84);
                auVar23._4_4_ = iVar49;
                auVar23._0_4_ = iVar49;
                auVar23._8_4_ = iVar50;
                auVar23._12_4_ = iVar50;
                auVar103 = pshufhw(auVar94,auVar23,0x84);
                auVar82 = pshufhw(auVar101,auVar117,0x84);
                auVar85._8_4_ = 0xffffffff;
                auVar85._0_8_ = 0xffffffffffffffff;
                auVar85._12_4_ = 0xffffffff;
                auVar85 = (auVar82 | auVar103 & auVar101) ^ auVar85;
                auVar101 = packssdw(auVar85,auVar85);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101._6_2_ >> 8 & 1) != 0) {
                  puVar59[-0x1c] = 0xff;
                }
                auVar101 = (auVar99 | auVar36) ^ auVar119;
                auVar95._0_4_ = -(uint)(iVar73 < auVar101._0_4_);
                auVar95._4_4_ = -(uint)(iVar71 < auVar101._4_4_);
                auVar95._8_4_ = -(uint)(iVar47 < auVar101._8_4_);
                auVar95._12_4_ = -(uint)(iVar48 < auVar101._12_4_);
                auVar24._4_4_ = auVar95._0_4_;
                auVar24._0_4_ = auVar95._0_4_;
                auVar24._8_4_ = auVar95._8_4_;
                auVar24._12_4_ = auVar95._8_4_;
                auVar103 = pshuflw(auVar117,auVar24,0xe8);
                auVar86._0_4_ = -(uint)(auVar101._0_4_ == iVar73);
                auVar86._4_4_ = -(uint)(auVar101._4_4_ == iVar71);
                auVar86._8_4_ = -(uint)(auVar101._8_4_ == iVar47);
                auVar86._12_4_ = -(uint)(auVar101._12_4_ == iVar48);
                auVar110._4_4_ = auVar86._4_4_;
                auVar110._0_4_ = auVar86._4_4_;
                auVar110._8_4_ = auVar86._12_4_;
                auVar110._12_4_ = auVar86._12_4_;
                auVar101 = pshuflw(auVar86,auVar110,0xe8);
                auVar111._4_4_ = auVar95._4_4_;
                auVar111._0_4_ = auVar95._4_4_;
                auVar111._8_4_ = auVar95._12_4_;
                auVar111._12_4_ = auVar95._12_4_;
                auVar82 = pshuflw(auVar95,auVar111,0xe8);
                auVar96._8_4_ = 0xffffffff;
                auVar96._0_8_ = 0xffffffffffffffff;
                auVar96._12_4_ = 0xffffffff;
                auVar96 = (auVar82 | auVar101 & auVar103) ^ auVar96;
                auVar82 = packssdw(auVar96,auVar96);
                auVar101 = packsswb(auVar101 & auVar103,auVar82);
                if ((auVar101 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar59[-0x20] = 0xff;
                }
                auVar25._4_4_ = auVar95._0_4_;
                auVar25._0_4_ = auVar95._0_4_;
                auVar25._8_4_ = auVar95._8_4_;
                auVar25._12_4_ = auVar95._8_4_;
                auVar111 = auVar110 & auVar25 | auVar111;
                auVar82 = packssdw(auVar111,auVar111);
                auVar13._8_4_ = 0xffffffff;
                auVar13._0_8_ = 0xffffffffffffffff;
                auVar13._12_4_ = 0xffffffff;
                auVar82 = packssdw(auVar82 ^ auVar13,auVar82 ^ auVar13);
                auVar101 = packsswb(auVar101,auVar82);
                if ((auVar101._8_2_ >> 8 & 1) != 0) {
                  puVar59[-0x24] = 0xff;
                }
                auVar101 = (auVar99 | auVar35) ^ auVar119;
                auVar97._0_4_ = -(uint)(iVar73 < auVar101._0_4_);
                auVar97._4_4_ = -(uint)(iVar71 < auVar101._4_4_);
                auVar97._8_4_ = -(uint)(iVar47 < auVar101._8_4_);
                auVar97._12_4_ = -(uint)(iVar48 < auVar101._12_4_);
                auVar112._4_4_ = auVar97._0_4_;
                auVar112._0_4_ = auVar97._0_4_;
                auVar112._8_4_ = auVar97._8_4_;
                auVar112._12_4_ = auVar97._8_4_;
                iVar49 = -(uint)(auVar101._4_4_ == iVar71);
                iVar50 = -(uint)(auVar101._12_4_ == iVar48);
                auVar26._4_4_ = iVar49;
                auVar26._0_4_ = iVar49;
                auVar26._8_4_ = iVar50;
                auVar26._12_4_ = iVar50;
                auVar118._4_4_ = auVar97._4_4_;
                auVar118._0_4_ = auVar97._4_4_;
                auVar118._8_4_ = auVar97._12_4_;
                auVar118._12_4_ = auVar97._12_4_;
                auVar101 = auVar26 & auVar112 | auVar118;
                auVar101 = packssdw(auVar101,auVar101);
                auVar14._8_4_ = 0xffffffff;
                auVar14._0_8_ = 0xffffffffffffffff;
                auVar14._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101 ^ auVar14,auVar101 ^ auVar14);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar59[-0x28] = 0xff;
                }
                auVar101 = pshufhw(auVar101,auVar112,0x84);
                auVar27._4_4_ = iVar49;
                auVar27._0_4_ = iVar49;
                auVar27._8_4_ = iVar50;
                auVar27._12_4_ = iVar50;
                auVar103 = pshufhw(auVar97,auVar27,0x84);
                auVar82 = pshufhw(auVar101,auVar118,0x84);
                auVar87._8_4_ = 0xffffffff;
                auVar87._0_8_ = 0xffffffffffffffff;
                auVar87._12_4_ = 0xffffffff;
                auVar87 = (auVar82 | auVar103 & auVar101) ^ auVar87;
                auVar101 = packssdw(auVar87,auVar87);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101._10_2_ >> 8 & 1) != 0) {
                  puVar59[-0x2c] = 0xff;
                }
                auVar101 = (auVar99 | _DAT_0015fca0) ^ auVar119;
                auVar98._0_4_ = -(uint)(iVar73 < auVar101._0_4_);
                auVar98._4_4_ = -(uint)(iVar71 < auVar101._4_4_);
                auVar98._8_4_ = -(uint)(iVar47 < auVar101._8_4_);
                auVar98._12_4_ = -(uint)(iVar48 < auVar101._12_4_);
                auVar28._4_4_ = auVar98._0_4_;
                auVar28._0_4_ = auVar98._0_4_;
                auVar28._8_4_ = auVar98._8_4_;
                auVar28._12_4_ = auVar98._8_4_;
                auVar103 = pshuflw(auVar118,auVar28,0xe8);
                auVar88._0_4_ = -(uint)(auVar101._0_4_ == iVar73);
                auVar88._4_4_ = -(uint)(auVar101._4_4_ == iVar71);
                auVar88._8_4_ = -(uint)(auVar101._8_4_ == iVar47);
                auVar88._12_4_ = -(uint)(auVar101._12_4_ == iVar48);
                auVar113._4_4_ = auVar88._4_4_;
                auVar113._0_4_ = auVar88._4_4_;
                auVar113._8_4_ = auVar88._12_4_;
                auVar113._12_4_ = auVar88._12_4_;
                auVar101 = pshuflw(auVar88,auVar113,0xe8);
                auVar114._4_4_ = auVar98._4_4_;
                auVar114._0_4_ = auVar98._4_4_;
                auVar114._8_4_ = auVar98._12_4_;
                auVar114._12_4_ = auVar98._12_4_;
                auVar82 = pshuflw(auVar98,auVar114,0xe8);
                auVar15._8_4_ = 0xffffffff;
                auVar15._0_8_ = 0xffffffffffffffff;
                auVar15._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101 & auVar103,(auVar82 | auVar101 & auVar103) ^ auVar15);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar59[-0x30] = 0xff;
                }
                auVar29._4_4_ = auVar98._0_4_;
                auVar29._0_4_ = auVar98._0_4_;
                auVar29._8_4_ = auVar98._8_4_;
                auVar29._12_4_ = auVar98._8_4_;
                auVar114 = auVar113 & auVar29 | auVar114;
                auVar82 = packssdw(auVar114,auVar114);
                auVar16._8_4_ = 0xffffffff;
                auVar16._0_8_ = 0xffffffffffffffff;
                auVar16._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101,auVar82 ^ auVar16);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101._12_2_ >> 8 & 1) != 0) {
                  puVar59[-0x34] = 0xff;
                }
                auVar101 = (auVar99 | _DAT_0015fc90) ^ auVar119;
                auVar89._0_4_ = -(uint)(iVar73 < auVar101._0_4_);
                auVar89._4_4_ = -(uint)(iVar71 < auVar101._4_4_);
                auVar89._8_4_ = -(uint)(iVar47 < auVar101._8_4_);
                auVar89._12_4_ = -(uint)(iVar48 < auVar101._12_4_);
                auVar115._4_4_ = auVar89._0_4_;
                auVar115._0_4_ = auVar89._0_4_;
                auVar115._8_4_ = auVar89._8_4_;
                auVar115._12_4_ = auVar89._8_4_;
                auVar100._4_4_ = -(uint)(auVar101._4_4_ == iVar71);
                auVar100._12_4_ = -(uint)(auVar101._12_4_ == iVar48);
                auVar100._0_4_ = auVar100._4_4_;
                auVar100._8_4_ = auVar100._12_4_;
                auVar102._4_4_ = auVar89._4_4_;
                auVar102._0_4_ = auVar89._4_4_;
                auVar102._8_4_ = auVar89._12_4_;
                auVar102._12_4_ = auVar89._12_4_;
                auVar82 = auVar100 & auVar115 | auVar102;
                auVar101 = packssdw(auVar89,auVar82);
                auVar17._8_4_ = 0xffffffff;
                auVar17._0_8_ = 0xffffffffffffffff;
                auVar17._12_4_ = 0xffffffff;
                auVar101 = packssdw(auVar101 ^ auVar17,auVar101 ^ auVar17);
                auVar101 = packsswb(auVar101,auVar101);
                if ((auVar101 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar59[-0x38] = 0xff;
                }
                auVar101 = pshufhw(auVar101,auVar115,0x84);
                in_XMM2 = pshufhw(auVar82,auVar100,0x84);
                in_XMM2 = in_XMM2 & auVar101;
                auVar101 = pshufhw(auVar101,auVar102,0x84);
                auVar90._8_4_ = 0xffffffff;
                auVar90._0_8_ = 0xffffffffffffffff;
                auVar90._12_4_ = 0xffffffff;
                auVar90 = (auVar101 | in_XMM2) ^ auVar90;
                auVar101 = packssdw(auVar90,auVar90);
                in_XMM1 = packsswb(auVar101,auVar101);
                if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                  puVar59[-0x3c] = 0xff;
                }
                uVar70 = uVar70 + 0x10;
                puVar59 = puVar59 + -0x40;
              } while ((uVar51 + 0x10 & 0x3ffffff0) != uVar70);
            }
            if ((int)local_88e4 < 1) {
              uVar76 = s->img_x;
            }
            else {
              uVar76 = s->img_x;
              if (0 < (int)sVar45 >> 1) {
                uVar51 = uVar76 * iVar46;
                uVar69 = (sVar45 - 1) * uVar51;
                uVar64 = 0;
                uVar70 = 0;
                do {
                  if (0 < (int)uVar51) {
                    uVar74 = 0;
                    do {
                      uVar2 = data_01[uVar74 + uVar64];
                      data_01[uVar74 + uVar64] = data_01[uVar74 + uVar69];
                      data_01[uVar74 + uVar69] = uVar2;
                      uVar74 = uVar74 + 1;
                    } while (uVar51 != uVar74);
                  }
                  uVar70 = uVar70 + 1;
                  uVar69 = uVar69 - uVar51;
                  uVar64 = uVar64 + uVar51;
                } while (uVar70 != (uint)((int)sVar45 >> 1));
              }
            }
            if ((req_comp != 0) && (iVar46 != req_comp)) {
              data_01 = stbi__convert_format(data_01,iVar46,req_comp,uVar76,sVar45);
              if (data_01 == (uchar *)0x0) {
                return (void *)0x0;
              }
              uVar76 = s->img_x;
            }
            *x = uVar76;
            *y = s->img_y;
            if (comp != (int *)0x0) {
              *comp = s->img_n;
              return data_01;
            }
            return data_01;
          }
        }
        pcVar54 = "too large";
        goto LAB_00132d2f;
      }
      lVar61 = lVar61 + 1;
    } while (lVar61 != 8);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if (4 < (uint)req_comp) {
      pcVar54 = "bad req_comp";
LAB_00132d2f:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar54;
      return (void *)0x0;
    }
    local_88a8._0_8_ = s;
    iVar46 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
    uVar8 = local_88a8._0_8_;
    if (iVar46 == 0) {
      psVar58 = (stbi__context *)0x0;
    }
    else {
      iVar46 = 8;
      if ((8 < local_88a8.flags) && (iVar46 = 0x10, local_88a8.flags != 0x10)) {
        pcVar54 = "bad bits_per_channel";
        goto LAB_00132d2f;
      }
      ri->bits_per_channel = iVar46;
      psVar58 = (stbi__context *)local_88a8.history;
      if ((req_comp != 0) && (iVar46 = *(int *)(local_88a8._0_8_ + 0xc), iVar46 != req_comp)) {
        if (local_88a8.flags < 9) {
          psVar58 = (stbi__context *)
                    stbi__convert_format
                              (local_88a8.history,iVar46,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4));
        }
        else {
          psVar58 = (stbi__context *)
                    stbi__convert_format16
                              ((stbi__uint16 *)local_88a8.history,iVar46,req_comp,
                               *(stbi__uint32 *)local_88a8._0_8_,
                               *(stbi__uint32 *)(local_88a8._0_8_ + 4));
        }
        *(int *)(uVar8 + 0xc) = req_comp;
        if (psVar58 == (stbi__context *)0x0) {
          return (void *)0x0;
        }
      }
      *x = *(stbi__uint32 *)uVar8;
      *y = *(stbi__uint32 *)(uVar8 + 4);
      if (comp != (int *)0x0) {
        *comp = *(int *)(uVar8 + 8);
      }
      local_88a8.history = (stbi_uc *)0x0;
    }
    free(local_88a8.history);
    free(local_88a8.background);
    psVar53 = (stbi__jpeg *)local_88a8.out;
  }
LAB_00134347:
  free(psVar53);
  return psVar58;
LAB_00133c01:
  bVar80 = false;
LAB_00133c03:
  if (!bVar80) goto LAB_0013432e;
LAB_00133c0b:
  bVar40 = psVar53->marker;
LAB_00133c16:
  if (bVar40 == 0xff) {
    do {
      psVar58 = psVar53->s;
      if ((psVar58->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00133c42:
        if (psVar58->img_buffer_end <= psVar58->img_buffer) goto LAB_00132f64;
      }
      else {
        iVar46 = (*(psVar58->io).eof)(psVar58->io_user_data);
        if (iVar46 != 0) {
          if (psVar58->read_from_callbacks != 0) goto LAB_00133c42;
          goto LAB_00132f64;
        }
      }
      sVar39 = stbi__get8(psVar53->s);
    } while (sVar39 != 0xff);
    sVar39 = stbi__get8(psVar53->s);
    psVar53->marker = sVar39;
  }
LAB_00132f64:
  bVar40 = stbi__get_marker(psVar53);
  goto LAB_00132ed8;
LAB_00134ce3:
  pcVar54 = "bad huffman code";
LAB_00134325:
  uVar76 = (uint)paVar65;
  *(char **)(in_FS_OFFSET + -0x10) = pcVar54;
  goto LAB_0013432e;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}